

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkFindMffcSize(Acb_Ntk_t *p,Vec_Int_t *vObjsRefed,Vec_Int_t *vObjsDerefed,int *nGates)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  Vec_Int_t *vRefs_00;
  int *piVar4;
  int local_4c;
  int Count2;
  int *pFanins;
  int local_38;
  int Fanin;
  int iObj;
  int i;
  Vec_Int_t *vRefs;
  int *nGates_local;
  Vec_Int_t *vObjsDerefed_local;
  Vec_Int_t *vObjsRefed_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_NtkObjNumMax(p);
  vRefs_00 = Vec_IntStart(iVar1);
  local_4c = 0;
  for (local_38 = 1; iVar1 = Vec_StrSize(&p->vObjType), local_38 < iVar1; local_38 = local_38 + 1) {
    AVar2 = Acb_ObjType(p,local_38);
    if (AVar2 != ABC_OPER_NONE) {
      Fanin = 0;
      piVar4 = Acb_ObjFanins(p,local_38);
      for (; Fanin < *piVar4; Fanin = Fanin + 1) {
        Vec_IntAddToEntry(vRefs_00,piVar4[Fanin + 1],1);
      }
    }
  }
  for (Fanin = 0; iVar1 = Vec_IntSize(vObjsRefed), Fanin < iVar1; Fanin = Fanin + 1) {
    iVar1 = Vec_IntEntry(vObjsRefed,Fanin);
    Acb_NtkNodeRef_rec(vRefs_00,p,iVar1,(int *)0x0);
  }
  for (Fanin = 0; iVar1 = Vec_IntSize(vObjsDerefed), Fanin < iVar1; Fanin = Fanin + 1) {
    iVar1 = Vec_IntEntry(vObjsDerefed,Fanin);
    iVar3 = Vec_IntEntry(vRefs_00,iVar1);
    if (iVar3 == 0) {
      iVar1 = Acb_NtkNodeRef_rec(vRefs_00,p,iVar1,nGates);
      local_4c = iVar1 + local_4c;
    }
  }
  Vec_IntFree(vRefs_00);
  return local_4c;
}

Assistant:

int Acb_NtkFindMffcSize( Acb_Ntk_t * p, Vec_Int_t * vObjsRefed, Vec_Int_t * vObjsDerefed, int nGates[5] )
{
    Vec_Int_t * vRefs = Vec_IntStart( Acb_NtkObjNumMax(p) );
    int i, iObj, Fanin, * pFanins, Count2 = 0;
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
            Vec_IntAddToEntry( vRefs, Fanin, 1 );
    Vec_IntForEachEntry( vObjsRefed, iObj, i )
        Acb_NtkNodeRef_rec( vRefs, p, iObj, NULL );
    Vec_IntForEachEntry( vObjsDerefed, iObj, i )
        if ( Vec_IntEntry(vRefs, iObj) == 0 )
            Count2 += Acb_NtkNodeRef_rec( vRefs, p, iObj, nGates );
    Vec_IntFree( vRefs );
    return Count2;
}